

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

int mcpl_internal_do_gzip(char *filename)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char *filename_00;
  gzFile pgVar3;
  char buf [16384];
  mcu8str amStack_4038 [683];
  
  mcu8str_view_cstr(amStack_4038,filename);
  __stream = (FILE *)mctools_fopen(amStack_4038,"rb");
  if (__stream != (FILE *)0x0) {
    sVar2 = strlen(filename);
    filename_00 = mcpl_internal_malloc(sVar2 + 4);
    memcpy(filename_00,filename,sVar2);
    builtin_strncpy(filename_00 + sVar2,".gz",4);
    pgVar3 = mcpl_gzopen(filename_00,"wb");
    free(filename_00);
    if (pgVar3 == (gzFile)0x0) {
      fclose(__stream);
    }
    else {
      do {
        sVar2 = fread(amStack_4038,1,0x4000,__stream);
        iVar1 = ferror(__stream);
        if (iVar1 != 0) break;
        if ((sVar2 & 0xffffffff) == 0) {
          fclose(__stream);
          iVar1 = gzclose(pgVar3);
          if (iVar1 != 0) {
            return 0;
          }
          unlink(filename);
          return 1;
        }
        iVar1 = gzwrite(pgVar3,amStack_4038,sVar2 & 0xffffffff);
      } while ((int)sVar2 == iVar1);
      fclose(__stream);
      gzclose(pgVar3);
    }
  }
  return 0;
}

Assistant:

MCPL_LOCAL int mcpl_internal_do_gzip(const char *filename)
{
  //Open input file:
  FILE *handle_in = mcpl_internal_fopen(filename, "rb");
  if (!handle_in)
    return 0;

  //Construct output file name by appending .gz:
  size_t nn = strlen(filename);
  char * outfn = mcpl_internal_malloc(nn + 4);
  memcpy(outfn,filename,nn);
  memcpy(outfn+nn,".gz",4);

  //Open output file:
  gzFile handle_out = mcpl_gzopen(outfn, "wb");

  free(outfn);

  if (!handle_out) {
    fclose(handle_in);
    return 0;
  }

  //Compress input to output:
  char buf[16384];
  size_t len;
  while (1) {
    len = (int)fread(buf, 1, sizeof(buf), handle_in);
    if (ferror(handle_in)) {
      fclose(handle_in);
      gzclose(handle_out);
      return 0;
    }
    if (!len)
      break;
    if ((size_t)gzwrite(handle_out, buf, (unsigned)len) != len) {
      fclose(handle_in);
      gzclose(handle_out);
      return 0;
    }
  }

  //close file:
  fclose(handle_in);
  if (gzclose(handle_out) != Z_OK)
    return 0;

  //remove input file and return success:
  mcpl_internal_delete_file( filename );
  return 1;

}